

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

bool jessilib::is_valid<std::__cxx11::u8string>
               (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                *in_string)

{
  char8_t *in_RDX;
  jessilib *this;
  pointer pcVar1;
  decode_result dVar2;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  
  pcVar1 = (in_string->_M_dataplus)._M_p;
  for (this = (jessilib *)in_string->_M_string_length; this != (jessilib *)0x0;
      this = this + -(long)in_RDX) {
    in_string_00._M_str = in_RDX;
    in_string_00._M_len = (size_t)pcVar1;
    dVar2 = decode_codepoint_utf8<char8_t>(this,in_string_00);
    in_RDX = (char8_t *)dVar2.units;
    if (in_RDX == (char8_t *)0x0) break;
    pcVar1 = pcVar1 + (long)in_RDX;
  }
  return this == (jessilib *)0x0;
}

Assistant:

std::pair<bool, std::basic_string<CharT>> mbstring_to_ustring(std::string_view in_mbstring) {
	std::pair<bool, std::basic_string<CharT>> result;

	std::mbstate_t mbstate{};
	while (!in_mbstring.empty()) {
		char32_t codepoint{};
		size_t bytes_read = std::mbrtoc32(&codepoint, in_mbstring.data(), in_mbstring.size(), &mbstate);
		if (bytes_read > in_mbstring.size()) {
			// Some sort of error; return
			result.first = false;
			return result;
		}

		// bytes_read is 0 for null characters; ensure null characters are also removed from the view
		bytes_read = std::max(size_t{1}, bytes_read);
		in_mbstring.remove_prefix(bytes_read);
		encode_codepoint(result.second, codepoint);
	}

	result.first = true;
	return result;
}